

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coleitr.cpp
# Opt level: O0

int32_t __thiscall icu_63::CollationElementIterator::getOffset(CollationElementIterator *this)

{
  UBool UVar1;
  int32_t iVar2;
  int iVar3;
  int32_t local_1c;
  int32_t i;
  CollationElementIterator *this_local;
  
  if (((this->dir_ < '\0') && (this->offsets_ != (UVector32 *)0x0)) &&
     (UVar1 = UVector32::isEmpty(this->offsets_), UVar1 == '\0')) {
    local_1c = CollationIterator::getCEsLength(this->iter_);
    if (this->otherHalf_ != 0) {
      local_1c = local_1c + 1;
    }
    iVar2 = UVector32::elementAti(this->offsets_,local_1c);
    return iVar2;
  }
  iVar3 = (*(this->iter_->super_UObject)._vptr_UObject[5])();
  return iVar3;
}

Assistant:

int32_t CollationElementIterator::getOffset() const
{
    if (dir_ < 0 && offsets_ != NULL && !offsets_->isEmpty()) {
        // CollationIterator::previousCE() decrements the CEs length
        // while it pops CEs from its internal buffer.
        int32_t i = iter_->getCEsLength();
        if (otherHalf_ != 0) {
            // Return the trailing CE offset while we are in the middle of a 64-bit CE.
            ++i;
        }
        U_ASSERT(i < offsets_->size());
        return offsets_->elementAti(i);
    }
    return iter_->getOffset();
}